

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

Transform * __thiscall SceneParser::parseTransform(SceneParser *this)

{
  float sy;
  long lVar1;
  float *pfVar2;
  Object3D *obj;
  Transform *this_00;
  int j;
  int j_00;
  char *token_00;
  int i;
  int i_00;
  float fVar3;
  Vector3f axis;
  char token [100];
  Matrix4f matrix;
  Matrix4f matrix2;
  undefined1 local_164 [180];
  Matrix4f local_b0;
  Matrix4f local_70;
  
  Matrix4f::identity();
  getToken(this,local_164 + 0xc);
  if (local_164._12_2_ != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1b7,"Transform *SceneParser::parseTransform()");
  }
  do {
    while( true ) {
      token_00 = local_164 + 0xc;
      getToken(this,token_00);
      if (CONCAT11(local_164[0x11],local_164[0x10]) != 0x65 ||
          CONCAT13(local_164[0xf],CONCAT12(local_164[0xe],local_164._12_2_)) != 0x6c616353) break;
      readVector3f((SceneParser *)local_164);
      pfVar2 = Vector3f::operator[]((Vector3f *)local_164,0);
      fVar3 = *pfVar2;
      pfVar2 = Vector3f::operator[]((Vector3f *)local_164,1);
      sy = *pfVar2;
      pfVar2 = Vector3f::operator[]((Vector3f *)local_164,2);
      Matrix4f::scaling((Matrix4f *)(local_164 + 0x74),fVar3,sy,*pfVar2);
LAB_0012c205:
      ::operator*(&local_b0,(Matrix4f *)(local_164 + 0x74));
      Matrix4f::operator=(&local_b0,&local_70);
    }
    if (CONCAT44(local_164._21_4_,
                 CONCAT13(local_164[0x14],
                          CONCAT12(local_164[0x13],CONCAT11(local_164[0x12],local_164[0x11])))) ==
        0x656c6163536d72 &&
        CONCAT17(local_164[0x13],
                 CONCAT16(local_164[0x12],
                          CONCAT15(local_164[0x11],
                                   CONCAT14(local_164[0x10],
                                            CONCAT13(local_164[0xf],
                                                     CONCAT12(local_164[0xe],local_164._12_2_))))))
        == 0x536d726f66696e55) {
      fVar3 = readFloat(this);
      Matrix4f::uniformScaling(fVar3);
      goto LAB_0012c205;
    }
    if (CONCAT11(local_164[0x15],local_164[0x14]) == 0x65 &&
        CONCAT17(local_164[0x13],
                 CONCAT16(local_164[0x12],
                          CONCAT15(local_164[0x11],
                                   CONCAT14(local_164[0x10],
                                            CONCAT13(local_164[0xf],
                                                     CONCAT12(local_164[0xe],local_164._12_2_))))))
        == 0x74616c736e617254) {
      readVector3f((SceneParser *)local_164);
      Matrix4f::translation((Matrix4f *)(local_164 + 0x74),(Vector3f *)local_164);
      goto LAB_0012c205;
    }
    lVar1 = CONCAT17(local_164[0x13],
                     CONCAT16(local_164[0x12],
                              CONCAT15(local_164[0x11],
                                       CONCAT14(local_164[0x10],
                                                CONCAT13(local_164[0xf],
                                                         CONCAT12(local_164[0xe],local_164._12_2_)))
                                      )));
    if (lVar1 == 0x657461746f525a) {
      fVar3 = readFloat(this);
      Matrix4f::rotateZ((Matrix4f *)(local_164 + 0x74),(fVar3 * 3.1415927) / 180.0);
      goto LAB_0012c205;
    }
    if (lVar1 == 0x657461746f5259) {
      fVar3 = readFloat(this);
      Matrix4f::rotateY((Matrix4f *)(local_164 + 0x74),(fVar3 * 3.1415927) / 180.0);
      goto LAB_0012c205;
    }
    if (lVar1 == 0x657461746f5258) {
      fVar3 = readFloat(this);
      Matrix4f::rotateX((Matrix4f *)(local_164 + 0x74),(fVar3 * 3.1415927) / 180.0);
      goto LAB_0012c205;
    }
    if (CONCAT13(local_164[0x12],CONCAT12(local_164[0x11],CONCAT11(local_164[0x10],local_164[0xf])))
        == 0x657461 &&
        CONCAT13(local_164[0xf],CONCAT12(local_164[0xe],local_164._12_2_)) == 0x61746f52) {
      getToken(this,token_00);
      if (local_164._12_2_ != 0x7b) {
        __assert_fail("!strcmp(token, \"{\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0x1ce,"Transform *SceneParser::parseTransform()");
      }
      readVector3f((SceneParser *)local_164);
      fVar3 = readFloat(this);
      Matrix4f::rotation((Matrix4f *)(local_164 + 0x74),(Vector3f *)local_164,
                         (fVar3 * 3.1415927) / 180.0);
      ::operator*(&local_b0,(Matrix4f *)(local_164 + 0x74));
      Matrix4f::operator=(&local_b0,&local_70);
      getToken(this,token_00);
      if (local_164._12_2_ != 0x7d) {
        __assert_fail("!strcmp(token, \"}\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0x1d4,"Transform *SceneParser::parseTransform()");
      }
    }
    else {
      if (local_164[0x14] != '\0' ||
          CONCAT17(local_164[0x13],
                   CONCAT16(local_164[0x12],
                            CONCAT15(local_164[0x11],
                                     CONCAT14(local_164[0x10],
                                              CONCAT13(local_164[0xf],
                                                       CONCAT12(local_164[0xe],local_164._12_2_)))))
                  ) != 0x663478697274614d) {
        obj = parseObject(this,local_164 + 0xc);
        getToken(this,local_164 + 0xc);
        if (local_164._12_2_ != 0x7d) {
          __assert_fail("!strcmp(token, \"}\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                        ,0x1ed,"Transform *SceneParser::parseTransform()");
        }
        this_00 = (Transform *)operator_new(0xb8);
        Transform::Transform(this_00,&local_b0,obj);
        return this_00;
      }
      Matrix4f::identity();
      getToken(this,token_00);
      if (local_164._12_2_ != 0x7b) {
        __assert_fail("!strcmp(token, \"{\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0x1d8,"Transform *SceneParser::parseTransform()");
      }
      j_00 = 0;
      do {
        i_00 = 0;
        do {
          fVar3 = readFloat(this);
          pfVar2 = Matrix4f::operator()(&local_70,i_00,j_00);
          *pfVar2 = fVar3;
          i_00 = i_00 + 1;
        } while (i_00 != 4);
        j_00 = j_00 + 1;
      } while (j_00 != 4);
      getToken(this,local_164 + 0xc);
      if (local_164._12_2_ != 0x7d) {
        __assert_fail("!strcmp(token, \"}\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0x1e0,"Transform *SceneParser::parseTransform()");
      }
      ::operator*(&local_70,&local_b0);
      Matrix4f::operator=(&local_b0,(Matrix4f *)(local_164 + 0x74));
    }
  } while( true );
}

Assistant:

Transform *
SceneParser::parseTransform() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    Matrix4f matrix = Matrix4f::identity();
    Object3D *object = NULL;
    getToken(token);
    assert(!strcmp(token, "{"));

    // Read in transformations:
    // apply to the LEFT side of the current matrix (so the first
    // transform in the list is the last applied to the object).
    getToken(token);
    while (true) {
        if (!strcmp(token, "Scale")) {
            Vector3f s = readVector3f();
            matrix = matrix * Matrix4f::scaling(s[0], s[1], s[2]);
        } else if (!strcmp(token, "UniformScale")) {
            float s = readFloat();
            matrix = matrix * Matrix4f::uniformScaling(s);
        } else if (!strcmp(token, "Translate")) {
            matrix = matrix * Matrix4f::translation(readVector3f());
        } else if (!strcmp(token, "XRotate")) {
            matrix = matrix * Matrix4f::rotateX((float) DegreesToRadians(readFloat()));
        } else if (!strcmp(token, "YRotate")) {
            matrix = matrix * Matrix4f::rotateY((float) DegreesToRadians(readFloat()));
        } else if (!strcmp(token, "ZRotate")) {
            matrix = matrix * Matrix4f::rotateZ((float) DegreesToRadians(readFloat()));
        } else if (!strcmp(token, "Rotate")) {
            getToken(token);
            assert(!strcmp(token, "{"));
            Vector3f axis = readVector3f();
            float degrees = readFloat();
            float radians = (float) DegreesToRadians(degrees);
            matrix = matrix * Matrix4f::rotation(axis, radians);
            getToken(token);
            assert(!strcmp(token, "}"));
        } else if (!strcmp(token, "Matrix4f")) {
            Matrix4f matrix2 = Matrix4f::identity();
            getToken(token);
            assert(!strcmp(token, "{"));
            for (int j = 0; j < 4; j++) {
                for (int i = 0; i < 4; i++) {
                    float v = readFloat();
                    matrix2(i, j) = v;
                }
            }
            getToken(token);
            assert(!strcmp(token, "}"));
            matrix = matrix2 * matrix;
        } else {
            // Otherwise this must be an object,
            // and there are no more transformations.
            object = parseObject(token);
            break;
        }
        getToken(token);
    }

    assert(object != NULL);
    getToken(token);
    assert(!strcmp(token, "}"));
    return new Transform(matrix, object);
}